

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int call_setter(JSContext *ctx,JSObject *setter,JSValue this_obj,JSValue val,int flags)

{
  JSStackFrame *pJVar1;
  JSValue v;
  JSValue JVar2;
  JSValue val_local;
  
  val_local.tag = val.tag;
  val_local.u = val.u;
  if (setter == (JSObject *)0x0) {
    JS_FreeValue(ctx,val);
    if (((uint)flags >> 0xe & 1) == 0) {
      if (-1 < (short)flags) {
        return 0;
      }
      pJVar1 = ctx->rt->current_stack_frame;
      if (pJVar1 == (JSStackFrame *)0x0) {
        return 0;
      }
      if ((pJVar1->js_mode & 1) == 0) {
        return 0;
      }
    }
    JS_ThrowTypeError(ctx,"no setter for property");
  }
  else {
    (setter->field_0).header.ref_count = (setter->field_0).header.ref_count + 1;
    JVar2.tag = -1;
    JVar2.u.ptr = setter;
    JVar2 = JS_CallFree(ctx,JVar2,this_obj,1,&val_local);
    v.tag = val_local.tag;
    v.u.float64 = val_local.u.float64;
    JS_FreeValue(ctx,v);
    if ((int)JVar2.tag != 6) {
      JS_FreeValue(ctx,JVar2);
      return 1;
    }
  }
  return -1;
}

Assistant:

static int call_setter(JSContext *ctx, JSObject *setter,
                       JSValueConst this_obj, JSValue val, int flags)
{
    JSValue ret, func;
    if (likely(setter)) {
        func = JS_MKPTR(JS_TAG_OBJECT, setter);
        /* Note: the field could be removed in the setter */
        func = JS_DupValue(ctx, func);
        ret = JS_CallFree(ctx, func, this_obj, 1, (JSValueConst *)&val);
        JS_FreeValue(ctx, val);
        if (JS_IsException(ret))
            return -1;
        JS_FreeValue(ctx, ret);
        return TRUE;
    } else {
        JS_FreeValue(ctx, val);
        if ((flags & JS_PROP_THROW) ||
            ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
            JS_ThrowTypeError(ctx, "no setter for property");
            return -1;
        }
        return FALSE;
    }
}